

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-product.c
# Opt level: O3

int coda_close(coda_product *product)

{
  int iVar1;
  coda_product_definition *pcVar2;
  int64_t **__ptr;
  long lVar3;
  
  if (product == (coda_product *)0x0) {
    coda_set_error(-100,"product file argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-product.c"
                   ,0x306);
  }
  else {
    if (product->product_variable_size != (long *)0x0) {
      free(product->product_variable_size);
      product->product_variable_size = (long *)0x0;
    }
    __ptr = product->product_variable;
    if (__ptr != (int64_t **)0x0) {
      pcVar2 = product->product_definition;
      if (0 < pcVar2->num_product_variables) {
        lVar3 = 0;
        do {
          if (product->product_variable[lVar3] != (int64_t *)0x0) {
            free(product->product_variable[lVar3]);
            pcVar2 = product->product_definition;
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 < pcVar2->num_product_variables);
        __ptr = product->product_variable;
      }
      free(__ptr);
      product->product_variable = (int64_t **)0x0;
    }
    switch(product->format) {
    case coda_format_ascii:
      iVar1 = coda_ascii_close(product);
      return iVar1;
    case coda_format_binary:
      iVar1 = coda_bin_close(product);
      return iVar1;
    case coda_format_xml:
      iVar1 = coda_xml_close(product);
      return iVar1;
    case coda_format_hdf4:
      iVar1 = -0xb;
      break;
    case coda_format_hdf5:
      iVar1 = -0xd;
      break;
    case coda_format_cdf:
      iVar1 = coda_cdf_close(product);
      return iVar1;
    case coda_format_netcdf:
      iVar1 = coda_netcdf_close(product);
      return iVar1;
    case coda_format_grib:
      iVar1 = coda_grib_close(product);
      return iVar1;
    case coda_format_rinex:
      iVar1 = coda_rinex_close(product);
      return iVar1;
    case coda_format_sp3:
      iVar1 = coda_sp3_close(product);
      return iVar1;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-product.c"
                    ,0x341,"int coda_close(coda_product *)");
    }
    coda_set_error(iVar1,(char *)0x0);
  }
  return -1;
}

Assistant:

LIBCODA_API int coda_close(coda_product *product)
{
    if (product == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "product file argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    /* remove product variable information */
    if (product->product_variable_size != NULL)
    {
        free(product->product_variable_size);
        product->product_variable_size = NULL;
    }
    if (product->product_variable != NULL)
    {
        int i;

        for (i = 0; i < product->product_definition->num_product_variables; i++)
        {
            if (product->product_variable[i] != NULL)
            {
                free(product->product_variable[i]);
            }
        }
        free(product->product_variable);
        product->product_variable = NULL;
    }

    switch (product->format)
    {
        case coda_format_ascii:
            return coda_ascii_close(product);
        case coda_format_binary:
            return coda_bin_close(product);
        case coda_format_xml:
            return coda_xml_close(product);
        case coda_format_cdf:
            return coda_cdf_close(product);
        case coda_format_netcdf:
            return coda_netcdf_close(product);
        case coda_format_grib:
            return coda_grib_close(product);
        case coda_format_hdf4:
#ifdef HAVE_HDF4
            return coda_hdf4_close(product);
#else
            coda_set_error(CODA_ERROR_NO_HDF4_SUPPORT, NULL);
            return -1;
#endif
        case coda_format_hdf5:
#ifdef HAVE_HDF5
            return coda_hdf5_close(product);
#else
            coda_set_error(CODA_ERROR_NO_HDF5_SUPPORT, NULL);
            return -1;
#endif
        case coda_format_rinex:
            return coda_rinex_close(product);
        case coda_format_sp3:
            return coda_sp3_close(product);
    }

    assert(0);
    exit(1);
}